

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O3

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
HistogramBasedDistribution::toDistribution
          (HistogramBasedDistribution *this,double tailCutoff,int *offset)

{
  long lVar1;
  iterator __position;
  bool bVar2;
  int *piVar3;
  vector<double,std::allocator<double>> *this_00;
  ulong uVar4;
  int iVar5;
  int *in_RDX;
  int *piVar6;
  double *pdVar7;
  int iVar8;
  pointer *__ptr;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  iVar10 = offset[2];
  piVar6 = *(int **)(offset + 4);
  uVar4 = *(long *)(offset + 6) - (long)piVar6 >> 4;
  uVar9 = 1;
  lVar13 = 0;
  dVar15 = 0.0;
  piVar3 = piVar6;
  do {
    dVar14 = dVar15;
    if (uVar4 + lVar13 == 0) {
      uVar12 = 0xffffffff;
      goto LAB_00177bb6;
    }
    iVar11 = offset[3];
    if (uVar9 < uVar4) {
      iVar11 = piVar3[4] + -1;
    }
    iVar8 = *piVar3;
    pdVar7 = (double *)(piVar3 + 2);
    dVar15 = (double)((iVar11 - iVar8) + 1) * *pdVar7 + dVar14;
    lVar13 = lVar13 + -1;
    uVar9 = uVar9 + 1;
    piVar3 = piVar3 + 4;
  } while (dVar15 <= tailCutoff);
  iVar10 = iVar8 + (int)((tailCutoff - dVar14) / *pdVar7);
  uVar12 = ~(uint)lVar13;
LAB_00177bb6:
  piVar6 = piVar6 + uVar4 * 4;
  uVar9 = uVar4;
  dVar15 = 0.0;
  do {
    dVar14 = dVar15;
    iVar11 = offset[3];
    if (uVar9 < uVar4) {
      iVar11 = *piVar6 + -1;
    }
    pdVar7 = (double *)(piVar6 + -2);
    dVar15 = (double)((iVar11 - piVar6[-4]) + 1) * *pdVar7 + dVar14;
    piVar6 = piVar6 + -4;
    uVar9 = uVar9 - 1;
  } while (dVar15 <= tailCutoff);
  iVar11 = iVar11 - (int)((tailCutoff - dVar14) / *pdVar7);
  this_00 = (vector<double,std::allocator<double>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  this->_vptr_HistogramBasedDistribution = (_func_int **)this_00;
  iVar8 = iVar10;
  while (iVar8 <= iVar11) {
    lVar13 = (long)(int)uVar12;
    uVar12 = uVar12 + 1;
    uVar4 = (ulong)(int)uVar12;
    while( true ) {
      lVar1 = *(long *)(offset + 4);
      uVar9 = *(long *)(offset + 6) - lVar1 >> 4;
      if (uVar4 < uVar9) {
        iVar5 = *(int *)(lVar1 + uVar4 * 0x10) + -1;
      }
      else {
        iVar5 = offset[3];
      }
      if (iVar5 < iVar8) break;
      pdVar7 = (double *)(lVar1 + lVar13 * 0x10 + 8);
      __position._M_current = *(double **)(this_00 + 8);
      if (__position._M_current == *(double **)(this_00 + 0x10)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this_00,__position,pdVar7);
      }
      else {
        *__position._M_current = *pdVar7;
        *(double **)(this_00 + 8) = __position._M_current + 1;
      }
      bVar2 = iVar11 <= iVar8;
      iVar8 = iVar8 + 1;
      if (bVar2) goto LAB_00177ccf;
    }
    if (uVar9 <= uVar4) break;
  }
LAB_00177ccf:
  *in_RDX = iVar10;
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<double> > HistogramBasedDistribution::toDistribution(double tailCutoff, int* offset) const {
	// determine start point
	int min_insert_length = min;
	int min_idx = -1;
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			min_insert_length = start + int((tailCutoff - p_sum) / values[i].second);
			min_idx = i;
			break;
		}
		p_sum += p;
	}
	// determine end point
	int max_insert_length = max;
	p_sum = 0.0;
	for (size_t i=values.size()-1; i>=0; --i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			max_insert_length = end - int((tailCutoff - p_sum) / values[i].second);
			break;
		}
		p_sum += p;
	}
	// create result
	unique_ptr<vector<double> > result(new vector<double>());
	int k = min_idx;
	int i = min_insert_length;
	while (i <= max_insert_length) {
		int start = values[k].first;
		int end = (k+1 < values.size())? values[k+1].first-1:max;
		assert(start <= i);
		if (i > end) {
			k += 1;
			if (k >= values.size()) break;
			else continue;
		}
		result->push_back(values[k].second);
		i += 1;
	}
	*offset = min_insert_length;
	return result;
}